

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams
          (BiDirectionalLSTMLayerParams *this)

{
  Arena *pAVar1;
  BiDirectionalLSTMLayerParams *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (pAVar1 == (Arena *)0x0) {
    SharedDtor(this);
    google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::~RepeatedPtrField
            (&this->weightparams_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::~RepeatedPtrField
            (&this->activationsbackwardlstm_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::~RepeatedPtrField
            (&this->activationsforwardlstm_);
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BiDirectionalLSTMLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}